

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImVec2 *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 col_00;
  float *pfVar3;
  ImVec2 *pIVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImVec2 local_60;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  pIVar2 = GImGui;
  fVar10 = (bb->Min).x;
  local_58._4_4_ = 0.0;
  pfVar3 = &(GImGui->Style).FrameRounding;
  if (((uint)flags >> 0x15 & 1) == 0) {
    pfVar3 = &(GImGui->Style).TabRounding;
  }
  fVar9 = ((bb->Max).x - fVar10) * 0.5 + -1.0;
  fVar11 = *pfVar3;
  if (fVar9 <= *pfVar3) {
    fVar11 = fVar9;
  }
  local_58._0_4_ = (bb->Min).y + 1.0;
  fVar9 = (bb->Max).y + -1.0;
  local_48 = ZEXT416(~-(uint)(fVar11 <= 0.0) & (uint)fVar11);
  iVar7 = (draw_list->_Path).Size;
  if (iVar7 == (draw_list->_Path).Capacity) {
    _local_58 = ZEXT416((uint)local_58._0_4_);
    if (iVar7 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar7 / 2 + iVar7;
    }
    iVar8 = iVar7 + 1;
    if (iVar7 + 1 < iVar6) {
      iVar8 = iVar6;
    }
    pIVar4 = (ImVec2 *)MemAlloc((long)iVar8 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar4;
    (draw_list->_Path).Capacity = iVar8;
    iVar7 = (draw_list->_Path).Size;
  }
  else {
    pIVar4 = (draw_list->_Path).Data;
  }
  pIVar4[iVar7].x = fVar10;
  pIVar4[iVar7].y = fVar9;
  (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
  fVar10 = (bb->Min).x + (float)local_48._0_4_;
  fVar11 = (float)local_58._0_4_ + (float)local_48._0_4_;
  fStack_4c = (float)local_58._4_4_ + (float)local_48._0_4_;
  local_58._4_4_ = fVar11;
  local_58._0_4_ = fVar10;
  fStack_50 = (float)local_48._0_4_ + 0.0;
  local_60.y = fVar11;
  local_60.x = fVar10;
  ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,6,9);
  local_60.x = (bb->Max).x - (float)local_48._0_4_;
  ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,9,0xc);
  fVar10 = (bb->Max).x;
  iVar7 = (draw_list->_Path).Size;
  if (iVar7 == (draw_list->_Path).Capacity) {
    if (iVar7 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar7 / 2 + iVar7;
    }
    iVar8 = iVar7 + 1;
    if (iVar7 + 1 < iVar6) {
      iVar8 = iVar6;
    }
    pIVar4 = (ImVec2 *)MemAlloc((long)iVar8 << 3);
    pIVar1 = (draw_list->_Path).Data;
    if (pIVar1 != (ImVec2 *)0x0) {
      memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
      MemFree((draw_list->_Path).Data);
    }
    (draw_list->_Path).Data = pIVar4;
    (draw_list->_Path).Capacity = iVar8;
    iVar7 = (draw_list->_Path).Size;
  }
  else {
    pIVar4 = (draw_list->_Path).Data;
  }
  pIVar4[iVar7].x = fVar10;
  pIVar4[iVar7].y = fVar9;
  iVar7 = (draw_list->_Path).Size + 1;
  (draw_list->_Path).Size = iVar7;
  ImDrawList::AddConvexPolyFilled(draw_list,(draw_list->_Path).Data,iVar7,col);
  (draw_list->_Path).Size = 0;
  if (0.0 < (pIVar2->Style).TabBorderSize) {
    fVar10 = (bb->Min).x;
    if ((draw_list->_Path).Capacity == 0) {
      pIVar4 = (ImVec2 *)MemAlloc(0x40);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar4;
      (draw_list->_Path).Capacity = 8;
      lVar5 = (long)(draw_list->_Path).Size;
    }
    else {
      pIVar4 = (draw_list->_Path).Data;
      lVar5 = 0;
    }
    pIVar4[lVar5].x = fVar10 + 0.5;
    pIVar4[lVar5].y = fVar9;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    local_58._0_4_ = (bb->Min).x + (float)local_48._0_4_ + 0.5;
    local_58._4_4_ = (float)local_58._4_4_ + 0.5;
    fStack_50 = fStack_50 + 0.0;
    fStack_4c = fStack_4c + 0.0;
    local_60.y = (float)local_58._4_4_;
    local_60.x = (float)local_58._0_4_;
    ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,6,9);
    local_60.y = (float)local_58._4_4_;
    local_60.x = ((bb->Max).x - (float)local_48._0_4_) + -0.5;
    ImDrawList::PathArcToFast(draw_list,&local_60,(float)local_48._0_4_,9,0xc);
    fVar10 = (bb->Max).x;
    iVar7 = (draw_list->_Path).Size;
    if (iVar7 == (draw_list->_Path).Capacity) {
      if (iVar7 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar7 / 2 + iVar7;
      }
      iVar8 = iVar7 + 1;
      if (iVar7 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      pIVar4 = (ImVec2 *)MemAlloc((long)iVar8 << 3);
      pIVar1 = (draw_list->_Path).Data;
      if (pIVar1 != (ImVec2 *)0x0) {
        memcpy(pIVar4,pIVar1,(long)(draw_list->_Path).Size << 3);
        MemFree((draw_list->_Path).Data);
      }
      (draw_list->_Path).Data = pIVar4;
      (draw_list->_Path).Capacity = iVar8;
      iVar7 = (draw_list->_Path).Size;
    }
    else {
      pIVar4 = (draw_list->_Path).Data;
    }
    pIVar4[iVar7].x = fVar10 + -0.5;
    pIVar4[iVar7].y = fVar9;
    (draw_list->_Path).Size = (draw_list->_Path).Size + 1;
    col_00 = GetColorU32(5,1.0);
    ImDrawList::AddPolyline
              (draw_list,(draw_list->_Path).Data,(draw_list->_Path).Size,col_00,false,
               (pIVar2->Style).TabBorderSize);
    (draw_list->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin((flags & ImGuiTabItemFlags_Button) ? g.Style.FrameRounding : g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}